

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBZR.cxx
# Opt level: O0

void __thiscall
cmCTestBZR::UpdateParser::DoPath(UpdateParser *this,char c0,char c1,char c2,string *path)

{
  ulong uVar1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestVC::File,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestVC::File>_>_>
  *pmVar2;
  mapped_type *pmVar3;
  undefined1 local_60 [8];
  string name;
  string dir;
  string *path_local;
  char c2_local;
  char c1_local;
  char c0_local;
  UpdateParser *this_local;
  
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    cmsys::SystemTools::ConvertToUnixSlashes(path);
    cmsys::SystemTools::GetFilenamePath((string *)((long)&name.field_2 + 8),path);
    cmsys::SystemTools::GetFilenameName((string *)local_60,path);
    if (c0 == 'C') {
      pmVar2 = &std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGlobalVC::Directory,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGlobalVC::Directory>_>_>
                ::operator[](&(this->BZR->super_cmCTestGlobalVC).Dirs,
                             (key_type *)((long)&name.field_2 + 8))->
                super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestVC::File,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestVC::File>_>_>
      ;
      pmVar3 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestVC::File,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestVC::File>_>_>
               ::operator[](pmVar2,(key_type *)local_60);
      pmVar3->Status = PathConflicting;
    }
    else if ((((c1 == 'M') || (c1 == 'K')) || (c1 == 'N')) || ((c1 == 'D' || (c2 == '*')))) {
      pmVar2 = &std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGlobalVC::Directory,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGlobalVC::Directory>_>_>
                ::operator[](&(this->BZR->super_cmCTestGlobalVC).Dirs,
                             (key_type *)((long)&name.field_2 + 8))->
                super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestVC::File,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestVC::File>_>_>
      ;
      pmVar3 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestVC::File,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestVC::File>_>_>
               ::operator[](pmVar2,(key_type *)local_60);
      pmVar3->Status = PathUpdated;
    }
    std::__cxx11::string::~string((string *)local_60);
    std::__cxx11::string::~string((string *)(name.field_2._M_local_buf + 8));
  }
  return;
}

Assistant:

void DoPath(char c0, char c1, char c2, std::string path)
    {
    if(path.empty()) return;
    cmSystemTools::ConvertToUnixSlashes(path);

    const std::string dir = cmSystemTools::GetFilenamePath(path);
    const std::string name = cmSystemTools::GetFilenameName(path);

    if ( c0=='C' )
      {
      this->BZR->Dirs[dir][name].Status = PathConflicting;
      return;
      }

    if ( c1=='M' || c1=='K' || c1=='N' || c1=='D' || c2 =='*' )
      {
      this->BZR->Dirs[dir][name].Status = PathUpdated;
      return;
      }
    }